

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FontInfo.cpp
# Opt level: O0

void __thiscall FontInfo::writeToTextFile(FontInfo *this,string *fileName)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined2 uVar4;
  undefined2 uVar5;
  bool bVar6;
  _Setw _Var7;
  ostream *poVar8;
  void *pvVar9;
  size_type sVar10;
  vector<FontInfo::Char,_std::allocator<FontInfo::Char>_> *pvVar11;
  const_reference pvVar12;
  reference pCVar13;
  reference pKVar14;
  uint8_t charSet;
  uint local_2d8;
  uint uStack_2d4;
  Kerning k;
  const_iterator __end2;
  const_iterator __begin2;
  vector<FontInfo::Kerning,_std::allocator<FontInfo::Kerning>_> *__range2;
  uint uStack_288;
  ushort uStack_284;
  ushort uStack_282;
  Char c;
  const_iterator __end1;
  const_iterator __begin1;
  vector<FontInfo::Char,_std::allocator<FontInfo::Char>_> *__range1;
  size_t i;
  string local_248;
  ostream local_218 [8];
  ofstream f;
  string *fileName_local;
  FontInfo *this_local;
  
  std::ofstream::ofstream(local_218,(string *)fileName,_S_out);
  poVar8 = std::operator<<(local_218,"info");
  poVar8 = std::operator<<(poVar8," face=\"");
  poVar8 = std::operator<<(poVar8,(string *)&(this->info).face);
  poVar8 = std::operator<<(poVar8,"\"");
  poVar8 = std::operator<<(poVar8," size=");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,(this->info).size);
  poVar8 = std::operator<<(poVar8," bold=");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,(bool)((this->info).bold & 1));
  poVar8 = std::operator<<(poVar8," italic=");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,(bool)((this->info).italic & 1));
  poVar8 = std::operator<<(poVar8," charset=\"");
  i._6_1_ = 0;
  if (((this->info).unicode & 1U) == 0) {
    getCharSetName_abi_cxx11_(&local_248,(FontInfo *)(ulong)(this->info).charset,charSet);
  }
  else {
    std::allocator<char>::allocator();
    i._6_1_ = 1;
    std::__cxx11::string::string((string *)&local_248,"",(allocator *)((long)&i + 7));
  }
  poVar8 = std::operator<<(poVar8,(string *)&local_248);
  poVar8 = std::operator<<(poVar8,"\"");
  poVar8 = std::operator<<(poVar8," unicode=");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,(bool)((this->info).unicode & 1));
  poVar8 = std::operator<<(poVar8," stretchH=");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,(this->info).stretchH);
  poVar8 = std::operator<<(poVar8," smooth=");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,(bool)((this->info).smooth & 1));
  poVar8 = std::operator<<(poVar8," aa=");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,(uint)(this->info).aa);
  poVar8 = std::operator<<(poVar8," padding=");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,(uint)(this->info).padding.up);
  poVar8 = std::operator<<(poVar8,",");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,(uint)(this->info).padding.right);
  poVar8 = std::operator<<(poVar8,",");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,(uint)(this->info).padding.down);
  poVar8 = std::operator<<(poVar8,",");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,(uint)(this->info).padding.left);
  poVar8 = std::operator<<(poVar8," spacing=");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,(uint)(this->info).spacing.horizontal);
  poVar8 = std::operator<<(poVar8,",");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,(uint)(this->info).spacing.vertical);
  poVar8 = std::operator<<(poVar8," outline=");
  pvVar9 = (void *)std::ostream::operator<<(poVar8,(uint)(this->info).outline);
  std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_248);
  if ((i._6_1_ & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)((long)&i + 7));
  }
  poVar8 = std::operator<<(local_218,"common");
  poVar8 = std::operator<<(poVar8," lineHeight=");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,(this->common).lineHeight);
  poVar8 = std::operator<<(poVar8," base=");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,(this->common).base);
  poVar8 = std::operator<<(poVar8," scaleW=");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,(this->common).scaleW);
  poVar8 = std::operator<<(poVar8," scaleH=");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,(this->common).scaleH);
  poVar8 = std::operator<<(poVar8," pages=");
  sVar10 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::size(&this->pages);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,sVar10);
  poVar8 = std::operator<<(poVar8," packed=");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,(bool)((this->common).packed & 1));
  poVar8 = std::operator<<(poVar8," alphaChnl=");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,(uint)(this->common).alphaChnl);
  poVar8 = std::operator<<(poVar8," redChnl=");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,(uint)(this->common).redChnl);
  poVar8 = std::operator<<(poVar8," greenChnl=");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,(uint)(this->common).greenChnl);
  poVar8 = std::operator<<(poVar8," blueChnl=");
  std::ostream::operator<<(poVar8,(uint)(this->common).blueChnl);
  if ((this->extraInfo & 1U) != 0) {
    poVar8 = std::operator<<(local_218," totalHeight=");
    std::ostream::operator<<(poVar8,(this->common).totalHeight);
  }
  std::ostream::operator<<(local_218,std::endl<char,std::char_traits<char>>);
  for (__range1 = (vector<FontInfo::Char,_std::allocator<FontInfo::Char>_> *)0x0;
      pvVar11 = (vector<FontInfo::Char,_std::allocator<FontInfo::Char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&this->pages), __range1 < pvVar11;
      __range1 = (vector<FontInfo::Char,_std::allocator<FontInfo::Char>_> *)
                 ((long)&(__range1->
                         super__Vector_base<FontInfo::Char,_std::allocator<FontInfo::Char>_>).
                         _M_impl.super__Vector_impl_data._M_start + 1)) {
    poVar8 = std::operator<<(local_218,"page id=");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,(ulong)__range1);
    poVar8 = std::operator<<(poVar8," file=\"");
    pvVar12 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](&this->pages,(size_type)__range1);
    poVar8 = std::operator<<(poVar8,(string *)pvVar12);
    poVar8 = std::operator<<(poVar8,"\"");
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
  }
  poVar8 = std::operator<<(local_218,"chars count=");
  sVar10 = std::vector<FontInfo::Char,_std::allocator<FontInfo::Char>_>::size(&this->chars);
  pvVar9 = (void *)std::ostream::operator<<(poVar8,sVar10);
  std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(local_218,std::left);
  __end1 = std::vector<FontInfo::Char,_std::allocator<FontInfo::Char>_>::begin(&this->chars);
  register0x00000000 =
       std::vector<FontInfo::Char,_std::allocator<FontInfo::Char>_>::end(&this->chars);
  while (bVar6 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_FontInfo::Char_*,_std::vector<FontInfo::Char,_std::allocator<FontInfo::Char>_>_>
                                     *)&c.xadvance), bVar6) {
    pCVar13 = __gnu_cxx::
              __normal_iterator<const_FontInfo::Char_*,_std::vector<FontInfo::Char,_std::allocator<FontInfo::Char>_>_>
              ::operator*(&__end1);
    c._8_4_ = *(undefined4 *)&pCVar13->xadvance;
    uVar3 = pCVar13->id;
    uVar4 = pCVar13->x;
    uVar5 = pCVar13->y;
    c._0_8_ = *(undefined8 *)&pCVar13->width;
    poVar8 = std::operator<<(local_218,"char");
    poVar8 = std::operator<<(poVar8," id=");
    _Var7 = std::setw(4);
    poVar8 = std::operator<<(poVar8,_Var7);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,uVar3);
    poVar8 = std::operator<<(poVar8," x=");
    _Var7 = std::setw(5);
    poVar8 = std::operator<<(poVar8,_Var7);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,uVar4);
    poVar8 = std::operator<<(poVar8," y=");
    _Var7 = std::setw(5);
    poVar8 = std::operator<<(poVar8,_Var7);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,uVar5);
    poVar8 = std::operator<<(poVar8," width=");
    _Var7 = std::setw(5);
    poVar8 = std::operator<<(poVar8,_Var7);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,(ushort)c.id);
    poVar8 = std::operator<<(poVar8," height=");
    _Var7 = std::setw(5);
    poVar8 = std::operator<<(poVar8,_Var7);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,c.id._2_2_);
    poVar8 = std::operator<<(poVar8," xoffset=");
    _Var7 = std::setw(5);
    poVar8 = std::operator<<(poVar8,_Var7);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,c.x);
    poVar8 = std::operator<<(poVar8," yoffset=");
    _Var7 = std::setw(5);
    poVar8 = std::operator<<(poVar8,_Var7);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,c.y);
    poVar8 = std::operator<<(poVar8," xadvance=");
    _Var7 = std::setw(5);
    poVar8 = std::operator<<(poVar8,_Var7);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,c.width);
    poVar8 = std::operator<<(poVar8," page=");
    _Var7 = std::setw(2);
    poVar8 = std::operator<<(poVar8,_Var7);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,(int)(char)c.height);
    poVar8 = std::operator<<(poVar8," chnl=");
    _Var7 = std::setw(2);
    poVar8 = std::operator<<(poVar8,_Var7);
    pvVar9 = (void *)std::ostream::operator<<(poVar8,(int)c.height._1_1_);
    std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<const_FontInfo::Char_*,_std::vector<FontInfo::Char,_std::allocator<FontInfo::Char>_>_>
    ::operator++(&__end1);
  }
  std::ostream::operator<<(local_218,std::right);
  bVar6 = std::vector<FontInfo::Kerning,_std::allocator<FontInfo::Kerning>_>::empty(&this->kernings)
  ;
  if (!bVar6) {
    poVar8 = std::operator<<(local_218,"kernings count=");
    sVar10 = std::vector<FontInfo::Kerning,_std::allocator<FontInfo::Kerning>_>::size
                       (&this->kernings);
    pvVar9 = (void *)std::ostream::operator<<(poVar8,sVar10);
    std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
    __end2 = std::vector<FontInfo::Kerning,_std::allocator<FontInfo::Kerning>_>::begin
                       (&this->kernings);
    register0x00000000 =
         std::vector<FontInfo::Kerning,_std::allocator<FontInfo::Kerning>_>::end(&this->kernings);
    while (bVar6 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_FontInfo::Kerning_*,_std::vector<FontInfo::Kerning,_std::allocator<FontInfo::Kerning>_>_>
                                       *)&k.amount), bVar6) {
      pKVar14 = __gnu_cxx::
                __normal_iterator<const_FontInfo::Kerning_*,_std::vector<FontInfo::Kerning,_std::allocator<FontInfo::Kerning>_>_>
                ::operator*(&__end2);
      k.first = *(uint32_t *)&pKVar14->amount;
      uVar1 = pKVar14->first;
      uVar2 = pKVar14->second;
      poVar8 = std::operator<<(local_218,"kerning ");
      poVar8 = std::operator<<(poVar8,"first=");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,uVar1);
      poVar8 = std::operator<<(poVar8," second=");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,uVar2);
      poVar8 = std::operator<<(poVar8," amount=");
      pvVar9 = (void *)std::ostream::operator<<(poVar8,(short)k.first);
      std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
      __gnu_cxx::
      __normal_iterator<const_FontInfo::Kerning_*,_std::vector<FontInfo::Kerning,_std::allocator<FontInfo::Kerning>_>_>
      ::operator++(&__end2);
    }
  }
  std::ofstream::~ofstream(local_218);
  return;
}

Assistant:

void FontInfo::writeToTextFile(const std::string &fileName) const
{
    std::ofstream f(fileName);

    f << "info"
        << " face=\"" << info.face << "\""
        << " size=" << info.size
        << " bold=" << info.bold
        << " italic=" << info.italic
        << " charset=\"" << (info.unicode ? "" : getCharSetName(info.charset)) << "\""
        << " unicode=" << info.unicode
        << " stretchH=" << info.stretchH
        << " smooth=" << info.smooth
        << " aa=" << static_cast<int>(info.aa)
        << " padding="
           << static_cast<int>(info.padding.up)
           << "," << static_cast<int>(info.padding.right)
           << "," << static_cast<int>(info.padding.down)
           << "," << static_cast<int>(info.padding.left)
        << " spacing="
            << static_cast<int>(info.spacing.horizontal)
            << "," << static_cast<int>(info.spacing.vertical)
        << " outline=" << static_cast<int>(info.outline)
        << std::endl;

    f << "common"
        << " lineHeight=" << common.lineHeight
        << " base=" << common.base
        << " scaleW=" << common.scaleW
        << " scaleH=" << common.scaleH
        << " pages=" << pages.size()
        << " packed=" << common.packed
        << " alphaChnl=" << static_cast<int>(common.alphaChnl)
        << " redChnl=" << static_cast<int>(common.redChnl)
        << " greenChnl=" << static_cast<int>(common.greenChnl)
        << " blueChnl=" << static_cast<int>(common.blueChnl);
    if (extraInfo)
        f << " totalHeight=" << common.totalHeight;
    f << std::endl;

    for (size_t i = 0; i < pages.size(); ++i)
        f << "page id=" << i << " file=\"" << pages[i] << "\"" << std::endl;

    f << "chars count=" << chars.size() << std::endl;
    f << std::left;
    for(auto c: chars)
    {
        f << "char"
            << " id=" <<  std::setw(4) << c.id
            << " x=" << std::setw(5) << c.x
            << " y=" << std::setw(5) << c.y
            << " width=" << std::setw(5) << c.width
            << " height=" << std::setw(5) << c.height
            << " xoffset=" << std::setw(5) << c.xoffset
            << " yoffset=" << std::setw(5) << c.yoffset
            << " xadvance=" << std::setw(5) << c.xadvance
            << " page=" << std::setw(2) << static_cast<int>(c.page)
            << " chnl=" << std::setw(2) << static_cast<int>(c.chnl)
            << std::endl;
    }
    f << std::right;
    if (!kernings.empty())
    {
        f << "kernings count=" << kernings.size() << std::endl;
        for(auto k: kernings)
        {
            f << "kerning "
              << "first=" << k.first
              << " second=" << k.second
              << " amount=" << k.amount
              << std::endl;
        }
    }
}